

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextFragmentData>::sizeRight
          (QFragmentMapData<QTextFragmentData> *this,uint node,uint field)

{
  QTextFragmentData *pQVar1;
  uint in_EDX;
  uint in_ESI;
  QFragmentMapData<QTextFragmentData> *in_RDI;
  QTextFragmentData *f;
  uint sr;
  uint local_14;
  uint local_c;
  
  local_14 = 0;
  pQVar1 = fragment(in_RDI,in_ESI);
  local_c = (pQVar1->super_QFragment<1>).right;
  while (local_c != 0) {
    pQVar1 = fragment(in_RDI,local_c);
    local_14 = (pQVar1->super_QFragment<1>).size_left_array[in_EDX] +
               (pQVar1->super_QFragment<1>).size_array[in_EDX] + local_14;
    local_c = (pQVar1->super_QFragment<1>).right;
  }
  return local_14;
}

Assistant:

inline uint sizeRight(uint node, uint field = 0) const {
        Q_ASSERT(field < Fragment::size_array_max);
        uint sr = 0;
        const Fragment *f = fragment(node);
        node = f->right;
        while (node) {
            f = fragment(node);
            sr += f->size_left_array[field] + f->size_array[field];
            node = f->right;
        }
        return sr;
    }